

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmem.c
# Opt level: O0

ppointer p_mem_mmap(psize n_bytes,PError **error)

{
  PErrorIO code;
  pint native_code;
  int map_flags;
  int fd;
  ppointer addr;
  PError **error_local;
  psize n_bytes_local;
  
  if (n_bytes == 0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    n_bytes_local = 0;
  }
  else {
    n_bytes_local = (psize)mmap((void *)0x0,n_bytes,3,0x22,-1,0);
    if ((void *)n_bytes_local == (void *)0xffffffffffffffff) {
      code = p_error_get_last_io();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to call mmap() to create file mapping");
      n_bytes_local = 0;
    }
  }
  return (ppointer)n_bytes_local;
}

Assistant:

P_LIB_API ppointer
p_mem_mmap (psize	n_bytes,
	    PError	**error)
{
	ppointer	addr;
#if defined (P_OS_WIN)
	HANDLE		hdl;
#elif defined (P_OS_BEOS)
	area_id		area;
#elif defined (P_OS_OS2)
	APIRET		ulrc;
#elif !defined (P_OS_AMIGA)
	int		fd;
	int		map_flags = MAP_PRIVATE;
#endif

	if (P_UNLIKELY (n_bytes == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

#if defined (P_OS_WIN)
	if (P_UNLIKELY ((hdl = CreateFileMappingA (INVALID_HANDLE_VALUE,
						   NULL,
						   PAGE_READWRITE,
						   0,
						   (DWORD) n_bytes,
						   NULL)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call CreateFileMapping() to create file mapping");
		return NULL;
	}

	if (P_UNLIKELY ((addr = MapViewOfFile (hdl,
					       FILE_MAP_READ | FILE_MAP_WRITE,
					       0,
					       0,
					       n_bytes)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call MapViewOfFile() to map file view");
		CloseHandle (hdl);
		return NULL;
	}

	if (P_UNLIKELY (!CloseHandle (hdl))) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call CloseHandle() to close file mapping");
		UnmapViewOfFile (addr);
		return NULL;
	}
#elif defined (P_OS_BEOS)
	if (P_LIKELY ((n_bytes % B_PAGE_SIZE)) != 0)
		n_bytes = (n_bytes / B_PAGE_SIZE + 1) * B_PAGE_SIZE;

	area = create_area ("", &addr, B_ANY_ADDRESS, n_bytes, B_NO_LOCK, B_READ_AREA | B_WRITE_AREA);

	if (P_UNLIKELY (area < B_NO_ERROR)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call create_area() to create memory area");
		return NULL;
	}
#elif defined (P_OS_OS2)
	if (P_UNLIKELY ((ulrc = DosAllocMem ((PPVOID) &addr,
					     (ULONG) n_bytes,
					     PAG_READ | PAG_WRITE | PAG_COMMIT |
					     OBJ_ANY)) != NO_ERROR)) {
		/* Try to remove OBJ_ANY */
		if (P_UNLIKELY ((ulrc = DosAllocMem ((PPVOID) &addr,
						     (ULONG) n_bytes,
						     PAG_READ | PAG_WRITE)) != NO_ERROR)) {
			p_error_set_error_p (error,
					     (pint) p_error_get_io_from_system ((pint) ulrc),
					     ulrc,
					     "Failed to call DosAllocMemory() to alocate memory");
			return NULL;
		}
	}
#elif defined (P_OS_AMIGA)
	addr = malloc (n_bytes);

	if (P_UNLIKELY (addr == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to allocate system memory");
		return NULL;
	}
#else
#  if !defined (PLIBSYS_MMAP_HAS_MAP_ANONYMOUS) && !defined (PLIBSYS_MMAP_HAS_MAP_ANON)
	if (P_UNLIKELY ((fd = open ("/dev/zero", O_RDWR | O_EXCL, 0754)) == -1)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to open /dev/zero for file mapping");
		return NULL;
	}
#  else
	fd = -1;
#  endif

#  ifdef PLIBSYS_MMAP_HAS_MAP_ANONYMOUS
	map_flags |= MAP_ANONYMOUS;
#  elif defined (PLIBSYS_MMAP_HAS_MAP_ANON)
	map_flags |= MAP_ANON;
#  endif

	if (P_UNLIKELY ((addr = mmap (NULL,
				      n_bytes,
				      PROT_READ | PROT_WRITE,
				      map_flags,
				      fd,
				      0)) == (void *) -1)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call mmap() to create file mapping");
#  if !defined (PLIBSYS_MMAP_HAS_MAP_ANONYMOUS) && !defined (PLIBSYS_MMAP_HAS_MAP_ANON)
		if (P_UNLIKELY (p_sys_close (fd) != 0))
			P_WARNING ("PMem::p_mem_mmap: failed to close file descriptor to /dev/zero");
#  endif
		return NULL;
	}

#  if !defined (PLIBSYS_MMAP_HAS_MAP_ANONYMOUS) && !defined (PLIBSYS_MMAP_HAS_MAP_ANON)
	if (P_UNLIKELY (p_sys_close (fd) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to close /dev/zero handle");
		munmap (addr, n_bytes);
		return NULL;
	}
#  endif
#endif

	return addr;
}